

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

UBool icu_63::enumAlgNames
                (AlgorithmicRange *range,UChar32 start,UChar32 limit,UEnumCharNamesFn *fn,
                void *context,UCharNameChoice nameChoice)

{
  char cVar1;
  UBool UVar2;
  ushort count_00;
  uint16_t uVar3;
  AlgorithmicRange *factors_00;
  char *pcVar4;
  ushort local_1e4;
  short local_1e2;
  char c_1;
  uint16_t idx;
  uint16_t i;
  char *pcStack_1e0;
  uint16_t prefixLength;
  char *t;
  char *suffix;
  char *s_1;
  uint16_t count;
  uint16_t *factors;
  char *elements [8];
  char *elementBases [8];
  uint16_t indexes [8];
  char *pcStack_120;
  char c;
  char *end;
  char *s;
  char local_108 [6];
  uint16_t length;
  char buffer [200];
  UCharNameChoice nameChoice_local;
  void *context_local;
  UEnumCharNamesFn *fn_local;
  UChar32 limit_local;
  UChar32 start_local;
  AlgorithmicRange *range_local;
  
  if ((nameChoice == U_UNICODE_CHAR_NAME) || (nameChoice == U_EXTENDED_CHAR_NAME)) {
    buffer._196_4_ = nameChoice;
    fn_local._4_4_ = start;
    if (range->type == '\0') {
      uVar3 = getAlgName(range,start,nameChoice,local_108,200);
      if (uVar3 == 0) {
        range_local._7_1_ = '\x01';
      }
      else {
        UVar2 = (*fn)(context,start,buffer._196_4_,local_108,(int32_t)uVar3);
        if (UVar2 == '\0') {
          range_local._7_1_ = '\0';
        }
        else {
          for (pcStack_120 = local_108; *pcStack_120 != '\0'; pcStack_120 = pcStack_120 + 1) {
          }
          do {
            fn_local._4_4_ = fn_local._4_4_ + 1;
            if (limit <= fn_local._4_4_) goto LAB_001e1b03;
            end = pcStack_120;
            while( true ) {
              pcVar4 = end + -1;
              cVar1 = end[-1];
              if ((('/' < cVar1) && (cVar1 < '9')) || (('@' < cVar1 && (cVar1 < 'F')))) {
                *pcVar4 = cVar1 + '\x01';
                goto LAB_001e177a;
              }
              if (cVar1 == '9') break;
              end = pcVar4;
              if (cVar1 == 'F') {
                *pcVar4 = '0';
              }
            }
            *pcVar4 = 'A';
LAB_001e177a:
            UVar2 = (*fn)(context,fn_local._4_4_,buffer._196_4_,local_108,(int32_t)uVar3);
          } while (UVar2 != '\0');
          range_local._7_1_ = '\0';
        }
      }
    }
    else if (range->type == '\x01') {
      factors_00 = range + 1;
      count_00 = (ushort)range->variant;
      local_1e2 = 0;
      t = local_108;
      suffix = (char *)((long)&factors_00->start + (long)(int)(uint)count_00 * 2);
      while( true ) {
        if (*suffix == '\0') break;
        *t = *suffix;
        local_1e2 = local_1e2 + 1;
        t = t + 1;
        suffix = suffix + 1;
      }
      uVar3 = writeFactorSuffix((uint16_t *)factors_00,count_00,suffix + 1,start - range->start,
                                (uint16_t *)(elementBases + 7),elements + 7,(char **)&factors,t,
                                200 - local_1e2);
      UVar2 = (*fn)(context,start,buffer._196_4_,local_108,(int)local_1e2 + (int)uVar3);
      if (UVar2 == '\0') {
        range_local._7_1_ = '\0';
      }
      else {
        do {
          fn_local._4_4_ = fn_local._4_4_ + 1;
          local_1e4 = count_00;
          if (limit <= fn_local._4_4_) goto LAB_001e1b03;
          while( true ) {
            local_1e4 = local_1e4 - 1;
            if ((ushort)(indexes[(ulong)local_1e4 - 4] + 1) <
                *(ushort *)((long)&factors_00->start + (ulong)local_1e4 * 2)) break;
            indexes[(ulong)local_1e4 - 4] = 0;
            elements[(ulong)local_1e4 - 1] = elements[(ulong)local_1e4 + 7];
          }
          indexes[(ulong)local_1e4 - 4] = indexes[(ulong)local_1e4 - 4] + 1;
          suffix = elements[(ulong)local_1e4 - 1];
          do {
            pcVar4 = suffix + 1;
            cVar1 = *suffix;
            suffix = pcVar4;
          } while (cVar1 != '\0');
          elements[(ulong)local_1e4 - 1] = pcVar4;
          pcStack_1e0 = t;
          s._6_2_ = local_1e2;
          for (local_1e4 = 0; local_1e4 < count_00; local_1e4 = local_1e4 + 1) {
            suffix = elements[(ulong)local_1e4 - 1];
            while( true ) {
              if (*suffix == '\0') break;
              *pcStack_1e0 = *suffix;
              s._6_2_ = s._6_2_ + 1;
              pcStack_1e0 = pcStack_1e0 + 1;
              suffix = suffix + 1;
            }
          }
          *pcStack_1e0 = '\0';
          UVar2 = (*fn)(context,fn_local._4_4_,buffer._196_4_,local_108,(int32_t)s._6_2_);
        } while (UVar2 != '\0');
        range_local._7_1_ = '\0';
      }
    }
    else {
LAB_001e1b03:
      range_local._7_1_ = '\x01';
    }
  }
  else {
    range_local._7_1_ = '\x01';
  }
  return range_local._7_1_;
}

Assistant:

static UBool
enumAlgNames(AlgorithmicRange *range,
             UChar32 start, UChar32 limit,
             UEnumCharNamesFn *fn, void *context,
             UCharNameChoice nameChoice) {
    char buffer[200];
    uint16_t length;

    if(nameChoice!=U_UNICODE_CHAR_NAME && nameChoice!=U_EXTENDED_CHAR_NAME) {
        return TRUE;
    }

    switch(range->type) {
    case 0: {
        char *s, *end;
        char c;

        /* get the full name of the start character */
        length=getAlgName(range, (uint32_t)start, nameChoice, buffer, sizeof(buffer));
        if(length<=0) {
            return TRUE;
        }

        /* call the enumerator function with this first character */
        if(!fn(context, start, nameChoice, buffer, length)) {
            return FALSE;
        }

        /* go to the end of the name; all these names have the same length */
        end=buffer;
        while(*end!=0) {
            ++end;
        }

        /* enumerate the rest of the names */
        while(++start<limit) {
            /* increment the hexadecimal number on a character-basis */
            s=end;
            for (;;) {
                c=*--s;
                if(('0'<=c && c<'9') || ('A'<=c && c<'F')) {
                    *s=(char)(c+1);
                    break;
                } else if(c=='9') {
                    *s='A';
                    break;
                } else if(c=='F') {
                    *s='0';
                }
            }

            if(!fn(context, start, nameChoice, buffer, length)) {
                return FALSE;
            }
        }
        break;
    }
    case 1: {
        uint16_t indexes[8];
        const char *elementBases[8], *elements[8];
        const uint16_t *factors=(const uint16_t *)(range+1);
        uint16_t count=range->variant;
        const char *s=(const char *)(factors+count);
        char *suffix, *t;
        uint16_t prefixLength, i, idx;

        char c;

        /* name = prefix factorized-elements */

        /* copy prefix */
        suffix=buffer;
        prefixLength=0;
        while((c=*s++)!=0) {
            *suffix++=c;
            ++prefixLength;
        }

        /* append the suffix of the start character */
        length=(uint16_t)(prefixLength+writeFactorSuffix(factors, count,
                                              s, (uint32_t)start-range->start,
                                              indexes, elementBases, elements,
                                              suffix, (uint16_t)(sizeof(buffer)-prefixLength)));

        /* call the enumerator function with this first character */
        if(!fn(context, start, nameChoice, buffer, length)) {
            return FALSE;
        }

        /* enumerate the rest of the names */
        while(++start<limit) {
            /* increment the indexes in lexical order bound by the factors */
            i=count;
            for (;;) {
                idx=(uint16_t)(indexes[--i]+1);
                if(idx<factors[i]) {
                    /* skip one index and its element string */
                    indexes[i]=idx;
                    s=elements[i];
                    while(*s++!=0) {
                    }
                    elements[i]=s;
                    break;
                } else {
                    /* reset this index to 0 and its element string to the first one */
                    indexes[i]=0;
                    elements[i]=elementBases[i];
                }
            }

            /* to make matters a little easier, just append all elements to the suffix */
            t=suffix;
            length=prefixLength;
            for(i=0; i<count; ++i) {
                s=elements[i];
                while((c=*s++)!=0) {
                    *t++=c;
                    ++length;
                }
            }
            /* zero-terminate */
            *t=0;

            if(!fn(context, start, nameChoice, buffer, length)) {
                return FALSE;
            }
        }
        break;
    }
    default:
        /* undefined type */
        break;
    }

    return TRUE;
}